

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedTimeZone::RuleBasedTimeZone(RuleBasedTimeZone *this,RuleBasedTimeZone *source)

{
  uint in_EAX;
  int iVar1;
  undefined4 extraout_var;
  UVector *pUVar2;
  RuleBasedTimeZone *this_00;
  UErrorCode status;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,&source->super_BasicTimeZone);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedTimeZone_003a6928;
  this_00 = (RuleBasedTimeZone *)source->fInitialRule;
  iVar1 = (*(((TimeZoneRule *)&this_00->super_BasicTimeZone)->super_UObject)._vptr_UObject[3])();
  this->fInitialRule = (InitialTimeZoneRule *)CONCAT44(extraout_var,iVar1);
  this->fHistoricTransitions = (UVector *)0x0;
  this->fUpToDate = '\0';
  pUVar2 = copyRules(this_00,source->fHistoricRules);
  this->fHistoricRules = pUVar2;
  pUVar2 = copyRules(this_00,source->fFinalRules);
  this->fFinalRules = pUVar2;
  if (source->fUpToDate != '\0') {
    uStack_18 = (ulong)(uint)uStack_18;
    complete(this,(UErrorCode *)((long)&uStack_18 + 4));
  }
  return;
}

Assistant:

RuleBasedTimeZone::RuleBasedTimeZone(const RuleBasedTimeZone& source)
: BasicTimeZone(source), fInitialRule(source.fInitialRule->clone()),
  fHistoricTransitions(NULL), fUpToDate(FALSE) {
    fHistoricRules = copyRules(source.fHistoricRules);
    fFinalRules = copyRules(source.fFinalRules);
    if (source.fUpToDate) {
        UErrorCode status = U_ZERO_ERROR;
        complete(status);
    }
}